

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  char cVar1;
  byte *pbVar2;
  char *in_RAX;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  int precision;
  uint local_14;
  
  do {
    cVar1 = *fmt;
    if (cVar1 == '\0') {
      iVar5 = 3;
      pcVar3 = in_RAX;
    }
    else if ((cVar1 != '%') || (iVar5 = 1, pcVar3 = fmt, fmt[1] == '%')) {
      fmt = fmt + (ulong)(cVar1 == '%') + 1;
      iVar5 = 0;
      pcVar3 = in_RAX;
    }
    in_RAX = pcVar3;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    fmt = pcVar3;
  }
  if (*fmt == '%') {
    pbVar2 = (byte *)(fmt + 1);
    do {
      pbVar4 = pbVar2;
      pbVar2 = pbVar4 + 1;
    } while ((byte)(*pbVar4 - 0x30) < 10);
    local_14 = 0x7fffffff;
    if ((*pbVar4 == 0x2e) &&
       (pbVar4 = (byte *)ImAtoi<int>((char *)(pbVar4 + 1),(int *)&local_14), 99 < local_14)) {
      local_14 = default_precision;
    }
    if ((*pbVar4 | 0x20) == 0x65) {
      local_14 = 0xffffffff;
    }
    if (((*pbVar4 == 0x67) || (*pbVar4 == 0x47)) && (local_14 == 0x7fffffff)) {
      local_14 = 0xffffffff;
    }
    if (local_14 != 0x7fffffff) {
      default_precision = local_14;
    }
  }
  return default_precision;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}